

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O2

REF_STATUS ref_search_dist3(REF_DBL *a,REF_DBL *b,REF_DBL *c,REF_DBL *p,REF_DBL *distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 in_EAX;
  int iVar8;
  undefined8 uVar9;
  char *pcVar10;
  double dVar11;
  REF_DBL RVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [16];
  
  dVar17 = *b;
  dVar23 = b[1];
  dVar37 = *a;
  dVar1 = a[1];
  dVar2 = b[2];
  dVar25 = a[2];
  dVar3 = *c;
  dVar4 = c[1];
  dVar5 = c[2];
  dVar27 = dVar17 - dVar37;
  dVar28 = dVar3 - dVar37;
  dVar29 = dVar23 - dVar1;
  dVar30 = dVar4 - dVar1;
  dVar24 = dVar2 - dVar25;
  dVar26 = dVar5 - dVar25;
  dVar32 = *p;
  dVar16 = p[1];
  dVar11 = dVar32 - dVar37;
  dVar15 = dVar16 - dVar1;
  dVar35 = p[2];
  dVar22 = dVar35 - dVar25;
  dVar39 = dVar22 * dVar24 + dVar11 * dVar27 + dVar15 * dVar29;
  auVar40._8_8_ = dVar22 * dVar26 + dVar11 * dVar28 + dVar15 * dVar30;
  auVar19._8_8_ = -(ulong)(auVar40._8_8_ <= 0.0);
  auVar19._0_8_ = -(ulong)(dVar39 <= 0.0);
  iVar8 = movmskpd(in_EAX,auVar19);
  if (iVar8 == 3) {
    RVar12 = SQRT(dVar22 * dVar22 + dVar11 * dVar11 + dVar15 * dVar15);
  }
  else {
    dVar11 = dVar32 - dVar17;
    dVar31 = dVar16 - dVar23;
    dVar33 = dVar35 - dVar2;
    dVar22 = dVar33 * dVar24 + dVar11 * dVar27 + dVar31 * dVar29;
    dVar15 = dVar33 * dVar26 + dVar11 * dVar28 + dVar31 * dVar30;
    if ((dVar22 < 0.0) || (dVar22 < dVar15)) {
      dVar11 = dVar39 * dVar15 - auVar40._8_8_ * dVar22;
      if ((-dVar22 < dVar22) || ((dVar39 < 0.0 || (0.0 < dVar11)))) {
        dVar31 = dVar32 - dVar3;
        dVar33 = dVar16 - dVar4;
        dVar34 = dVar35 - dVar5;
        dVar36 = dVar34 * dVar24 + dVar31 * dVar27 + dVar33 * dVar29;
        dVar38 = dVar34 * dVar26 + dVar31 * dVar28 + dVar33 * dVar30;
        if ((dVar38 < 0.0) || (dVar38 < dVar36)) {
          dVar39 = dVar36 * auVar40._8_8_ - dVar38 * dVar39;
          if (((0.0 < dVar38) || (0.0 < dVar39)) || (auVar40._8_8_ < 0.0)) {
            dVar31 = dVar22 * dVar38 - dVar15 * dVar36;
            if (((0.0 < dVar31) || (dVar15 = dVar15 - dVar22, dVar15 < 0.0)) ||
               (dVar36 - dVar38 < 0.0)) {
              dVar17 = dVar31 + dVar39 + dVar11;
              auVar13._0_8_ = dVar17 * 1e+20;
              auVar13._8_8_ = dVar39;
              auVar21._0_8_ = -auVar13._0_8_;
              auVar21._8_8_ = -dVar39;
              auVar19 = maxpd(auVar13,auVar21);
              if (auVar19._0_8_ <= auVar19._8_8_) {
                pcVar10 = "div zero vb / (va + vb + vc)";
                uVar9 = 0x2a1;
              }
              else {
                dVar23 = dVar11;
                if (dVar11 <= -dVar11) {
                  dVar23 = -dVar11;
                }
                if (dVar23 < auVar19._0_8_) {
                  dVar39 = dVar39 / dVar17;
                  dVar11 = dVar11 / dVar17;
                  dVar32 = dVar32 - (dVar28 * dVar11 + dVar39 * dVar27 + dVar37);
                  dVar16 = dVar16 - (dVar30 * dVar11 + dVar39 * dVar29 + dVar1);
                  dVar35 = dVar35 - (dVar26 * dVar11 + dVar39 * dVar24 + dVar25);
                  RVar12 = SQRT(dVar35 * dVar35 + dVar32 * dVar32 + dVar16 * dVar16);
                  goto LAB_001857c7;
                }
                pcVar10 = "div zero vc / (va + vb + vc)";
                uVar9 = 0x2a3;
              }
LAB_0018598b:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                     ,uVar9,"ref_search_dist3",pcVar10);
              return 1;
            }
            dVar37 = (dVar36 - dVar38) + dVar15;
            auVar14._0_8_ = dVar37 * 1e+20;
            auVar14._8_8_ = dVar15;
            auVar7._8_8_ = -dVar15;
            auVar7._0_8_ = -auVar14._0_8_;
            auVar19 = maxpd(auVar14,auVar7);
            if (auVar19._0_8_ <= auVar19._8_8_) {
              pcVar10 = "div zero (d4 - d3) / ((d4 - d3) + (d5 - d6))";
              uVar9 = 0x296;
              goto LAB_0018598b;
            }
            dVar15 = dVar15 / dVar37;
            dVar25 = (dVar5 - dVar2) * dVar15 + dVar2;
            dVar32 = dVar32 - ((dVar3 - dVar17) * dVar15 + dVar17);
            dVar16 = dVar16 - ((dVar4 - dVar23) * dVar15 + dVar23);
            dVar17 = dVar32 * dVar32 + dVar16 * dVar16;
          }
          else {
            dVar17 = (auVar40._8_8_ - dVar38) * 1e+20;
            auVar40._0_8_ = dVar17;
            auVar20._0_8_ = -dVar17;
            auVar20._8_8_ = -auVar40._8_8_;
            auVar19 = maxpd(auVar40,auVar20);
            if (auVar19._0_8_ <= auVar19._8_8_) {
              pcVar10 = "div zero d2/(d2-d6)";
              uVar9 = 0x287;
              goto LAB_0018598b;
            }
            dVar17 = auVar40._8_8_ / (auVar40._8_8_ - dVar38);
            dVar25 = dVar26 * dVar17 + dVar25;
            dVar32 = dVar32 - (dVar28 * dVar17 + dVar37);
            dVar16 = dVar16 - (dVar30 * dVar17 + dVar1);
            dVar17 = dVar32 * dVar32 + dVar16 * dVar16;
          }
          RVar12 = SQRT((dVar35 - dVar25) * (dVar35 - dVar25) + dVar17);
        }
        else {
          RVar12 = SQRT(dVar34 * dVar34 + dVar31 * dVar31 + dVar33 * dVar33);
        }
      }
      else {
        auVar18._0_8_ = (dVar39 - dVar22) * 1e+20;
        auVar18._8_8_ = dVar39;
        auVar6._8_8_ = -dVar39;
        auVar6._0_8_ = -auVar18._0_8_;
        auVar19 = maxpd(auVar18,auVar6);
        if (auVar19._0_8_ <= auVar19._8_8_) {
          pcVar10 = "div zero d1/(d1-d3)";
          uVar9 = 0x26c;
          goto LAB_0018598b;
        }
        dVar39 = dVar39 / (dVar39 - dVar22);
        dVar32 = dVar32 - (dVar27 * dVar39 + dVar37);
        dVar16 = dVar16 - (dVar29 * dVar39 + dVar1);
        dVar35 = dVar35 - (dVar39 * dVar24 + dVar25);
        RVar12 = SQRT(dVar35 * dVar35 + dVar32 * dVar32 + dVar16 * dVar16);
      }
    }
    else {
      RVar12 = SQRT(dVar33 * dVar33 + dVar11 * dVar11 + dVar31 * dVar31);
    }
  }
LAB_001857c7:
  *distance = RVar12;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_search_dist3(REF_DBL *a, REF_DBL *b, REF_DBL *c,
                                    REF_DBL *p, REF_DBL *distance) {
  REF_DBL ab[3], ac[3], ap[3];
  REF_DBL d1, d2;
  REF_DBL bp[3];
  REF_DBL d3, d4;
  REF_DBL vc, v;
  REF_DBL proj[3];
  REF_DBL cp[3];
  REF_DBL d5, d6;
  REF_DBL vb, va;
  REF_DBL w;

  /*
        printf("REF_DBL xyz0[]={%.15e, %.15e, %.15e};\n",a[0],a[1],a[2]);
        printf("REF_DBL xyz1[]={%.15e, %.15e, %.15e};\n",b[0],b[1],b[2]);
        printf("REF_DBL xyz2[]={%.15e, %.15e, %.15e};\n",c[0],c[1],c[2]);
        printf("REF_DBL xyz[]={%.15e, %.15e, %.15e};\n",p[0],p[1],p[2]);
   */

  /* Check if P in vertex region outside A */
  ab[0] = b[0] - a[0];
  ab[1] = b[1] - a[1];
  ab[2] = b[2] - a[2];

  ac[0] = c[0] - a[0];
  ac[1] = c[1] - a[1];
  ac[2] = c[2] - a[2];

  ap[0] = p[0] - a[0];
  ap[1] = p[1] - a[1];
  ap[2] = p[2] - a[2];

  d1 = ab[0] * ap[0] + ab[1] * ap[1] + ab[2] * ap[2];
  d2 = ac[0] * ap[0] + ac[1] * ap[1] + ac[2] * ap[2];
  if (d1 <= 0.0 && d2 <= 0.0) {
    *distance =
        sqrt((p[0] - a[0]) * (p[0] - a[0]) + (p[1] - a[1]) * (p[1] - a[1]) +
             (p[2] - a[2]) * (p[2] - a[2]));
    return REF_SUCCESS;
  }

  /* Check if P in vertex region outside B */
  bp[0] = p[0] - b[0];
  bp[1] = p[1] - b[1];
  bp[2] = p[2] - b[2];

  d3 = ab[0] * bp[0] + ab[1] * bp[1] + ab[2] * bp[2];
  d4 = ac[0] * bp[0] + ac[1] * bp[1] + ac[2] * bp[2];
  if (d3 >= 0.0 && d4 <= d3) {
    *distance =
        sqrt((p[0] - b[0]) * (p[0] - b[0]) + (p[1] - b[1]) * (p[1] - b[1]) +
             (p[2] - b[2]) * (p[2] - b[2]));
    return REF_SUCCESS;
  }

  /* Check if P in edge region of AB, if so return projection of P onto AB */
  vc = d1 * d4 - d3 * d2;
  if (vc <= 0.0 && d1 >= 0.0 && d3 <= 0.0) {
    RAS(ref_math_divisible(d1, (d1 - d3)), "div zero d1/(d1-d3)");
    v = d1 / (d1 - d3);
    proj[0] = a[0] + v * ab[0];
    proj[1] = a[1] + v * ab[1];
    proj[2] = a[2] + v * ab[2];
    *distance = sqrt((p[0] - proj[0]) * (p[0] - proj[0]) +
                     (p[1] - proj[1]) * (p[1] - proj[1]) +
                     (p[2] - proj[2]) * (p[2] - proj[2]));
    return REF_SUCCESS;
  }

  /* Check if P in vertex region outside C */
  cp[0] = p[0] - c[0];
  cp[1] = p[1] - c[1];
  cp[2] = p[2] - c[2];
  d5 = ab[0] * cp[0] + ab[1] * cp[1] + ab[2] * cp[2];
  d6 = ac[0] * cp[0] + ac[1] * cp[1] + ac[2] * cp[2];
  if (d6 >= 0.0 && d5 <= d6) {
    *distance =
        sqrt((p[0] - c[0]) * (p[0] - c[0]) + (p[1] - c[1]) * (p[1] - c[1]) +
             (p[2] - c[2]) * (p[2] - c[2]));
    return REF_SUCCESS;
  }

  /* Check if P in edge region of AC, if so return projection of P onto AC */
  vb = d5 * d2 - d1 * d6;
  if (vb <= 0.0 && d2 >= 0.0 && d6 <= 0.0) {
    RAS(ref_math_divisible(d2, (d2 - d6)), "div zero d2/(d2-d6)");
    v = d2 / (d2 - d6);
    proj[0] = a[0] + v * ac[0];
    proj[1] = a[1] + v * ac[1];
    proj[2] = a[2] + v * ac[2];
    *distance = sqrt((p[0] - proj[0]) * (p[0] - proj[0]) +
                     (p[1] - proj[1]) * (p[1] - proj[1]) +
                     (p[2] - proj[2]) * (p[2] - proj[2]));
    return REF_SUCCESS;
  }

  /* Check if P in edge region of BC, if so return projection of P onto BC */
  va = d3 * d6 - d5 * d4;
  if (va <= 0.0 && (d4 - d3) >= 0.0 && (d5 - d6) >= 0.0) {
    RAS(ref_math_divisible((d4 - d3), ((d4 - d3) + (d5 - d6))),
        "div zero (d4 - d3) / ((d4 - d3) + (d5 - d6))");
    v = (d4 - d3) / ((d4 - d3) + (d5 - d6));
    proj[0] = b[0] + v * (c[0] - b[0]);
    proj[1] = b[1] + v * (c[1] - b[1]);
    proj[2] = b[2] + v * (c[2] - b[2]);
    *distance = sqrt((p[0] - proj[0]) * (p[0] - proj[0]) +
                     (p[1] - proj[1]) * (p[1] - proj[1]) +
                     (p[2] - proj[2]) * (p[2] - proj[2]));
    return REF_SUCCESS;
  }

  RAS(ref_math_divisible(vb, (va + vb + vc)), "div zero vb / (va + vb + vc)");
  v = vb / (va + vb + vc);
  RAS(ref_math_divisible(vc, (va + vb + vc)), "div zero vc / (va + vb + vc)");
  w = vc / (va + vb + vc);
  proj[0] = a[0] + v * ab[0] + w * ac[0];
  proj[1] = a[1] + v * ab[1] + w * ac[1];
  proj[2] = a[2] + v * ab[2] + w * ac[2];
  *distance = sqrt((p[0] - proj[0]) * (p[0] - proj[0]) +
                   (p[1] - proj[1]) * (p[1] - proj[1]) +
                   (p[2] - proj[2]) * (p[2] - proj[2]));

  return REF_SUCCESS;
}